

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cpp
# Opt level: O2

bool chatter::platform::HostAddressStringToNet32(string *address,uint32_t *out)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RAX;
  in_addr addr;
  in_addr local_14;
  
  local_14.s_addr = (in_addr_t)((ulong)in_RAX >> 0x20);
  if (out != (uint32_t *)0x0) {
    bVar1 = std::operator==(address,"");
    if (bVar1) {
      *out = 0;
      bVar1 = true;
    }
    else {
      iVar2 = inet_aton((address->_M_dataplus)._M_p,&local_14);
      bVar1 = iVar2 != 0;
      if (bVar1) {
        *out = local_14.s_addr;
      }
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool HostAddressStringToNet32(const std::string address, uint32_t* out)
{
    if (!out)
        return false;

    if (address == "") {
        *out = INADDR_ANY;
        return true;
    }

    struct in_addr addr;
    if (inet_aton(address.c_str(), &addr) != 0) {
        *out = addr.s_addr;
        return true;
    }

    return false;
}